

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O3

void recff_io_write(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  IRIns *pIVar2;
  IRRef1 IVar3;
  IROpT IVar4;
  TRef TVar5;
  TRef TVar6;
  TRef TVar7;
  TRef TVar8;
  TRef TVar9;
  TRef TVar10;
  TRef *pTVar11;
  ulong uVar12;
  long lVar13;
  TRef ud;
  TRef local_34;
  
  TVar5 = recff_io_fp(J,&local_34,rd->data);
  TVar6 = lj_ir_kint(J,0);
  TVar7 = lj_ir_kint(J,1);
  uVar12 = (ulong)(rd->data == 0);
  pTVar11 = J->base;
  TVar8 = pTVar11[uVar12];
  if (TVar8 != 0) {
    lVar13 = uVar12 * 4;
    do {
      lVar13 = lVar13 + 4;
      TVar8 = lj_ir_tostr(J,TVar8);
      (J->fold).ins.field_0.ot = 0x3f05;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar6;
      TVar9 = lj_opt_fold(J);
      (J->fold).ins.field_0.op1 = (IRRef1)TVar8;
      *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x44130000;
      TVar10 = lj_opt_fold(J);
      if (((short)TVar10 < 0) || (pIVar2 = (J->cur).ir, pIVar2[TVar10 & 0x7fff].field_1.op12 != 1))
      {
        TVar8 = lj_ir_call(J,IRCALL_fwrite,(ulong)TVar9,(ulong)TVar7,(ulong)TVar10,(ulong)TVar5);
        IVar3 = (IRRef1)TVar8;
        uVar1 = *(uint *)((long)J->L->base + -4);
        IVar4 = 0x893;
        if (((uVar1 & 3) != 0) || (*(char *)((ulong)uVar1 - 1) != '\x01')) goto LAB_0013eb41;
      }
      else {
        uVar12 = (ulong)(TVar8 & 0xffff);
        if ((*(char *)((long)pIVar2 + uVar12 * 8 + 5) == '[') &&
           (*(short *)((long)pIVar2 + uVar12 * 8 + 2) == 2)) {
          uVar12 = (ulong)pIVar2[uVar12].field_0.op1;
        }
        else {
          (J->fold).ins.field_0.op1 = (IRRef1)TVar9;
          *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45100001;
          TVar8 = lj_opt_fold(J);
          uVar12 = (ulong)TVar8;
        }
        TVar8 = lj_ir_call(J,IRCALL_fputc,uVar12,(ulong)TVar5);
        IVar3 = (IRRef1)TVar8;
        uVar1 = *(uint *)((long)J->L->base + -4);
        if (((uVar1 & 3) != 0) || (*(char *)((ulong)uVar1 - 1) != '\x01')) {
          TVar10 = lj_ir_kint(J,-1);
          IVar4 = 0x993;
LAB_0013eb41:
          (J->fold).ins.field_0.ot = IVar4;
          (J->fold).ins.field_0.op1 = IVar3;
          (J->fold).ins.field_0.op2 = (IRRef1)TVar10;
          lj_opt_fold(J);
        }
      }
      pTVar11 = J->base;
      TVar8 = *(TRef *)((long)pTVar11 + lVar13);
    } while (TVar8 != 0);
  }
  *pTVar11 = 0x2007ffd;
  return;
}

Assistant:

static void LJ_FASTCALL recff_io_write(jit_State *J, RecordFFData *rd)
{
  TRef ud, fp = recff_io_fp(J, &ud, rd->data);
  TRef zero = lj_ir_kint(J, 0);
  TRef one = lj_ir_kint(J, 1);
  ptrdiff_t i = rd->data == 0 ? 1 : 0;
  for (; J->base[i]; i++) {
    TRef str = lj_ir_tostr(J, J->base[i]);
    TRef buf = emitir(IRT(IR_STRREF, IRT_PGC), str, zero);
    TRef len = emitir(IRTI(IR_FLOAD), str, IRFL_STR_LEN);
    if (tref_isk(len) && IR(tref_ref(len))->i == 1) {
      IRIns *irs = IR(tref_ref(str));
      TRef tr = (irs->o == IR_TOSTR && irs->op2 == IRTOSTR_CHAR) ?
		irs->op1 :
		emitir(IRT(IR_XLOAD, IRT_U8), buf, IRXLOAD_READONLY);
      tr = lj_ir_call(J, IRCALL_fputc, tr, fp);
      if (results_wanted(J) != 0)  /* Check result only if not ignored. */
	emitir(IRTGI(IR_NE), tr, lj_ir_kint(J, -1));
    } else {
      TRef tr = lj_ir_call(J, IRCALL_fwrite, buf, one, len, fp);
      if (results_wanted(J) != 0)  /* Check result only if not ignored. */
	emitir(IRTGI(IR_EQ), tr, len);
    }
  }
  J->base[0] = LJ_52 ? ud : TREF_TRUE;
}